

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O1

Color32 __thiscall nv::ColorBlock::averageColor(ColorBlock *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *in_RDI;
  uint uVar4;
  uint i;
  long lVar5;
  
  lVar5 = 0;
  uVar1 = 0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + this->m_color[lVar5].field_0.field_0.r;
    uVar3 = uVar3 + this->m_color[lVar5].field_0.field_0.g;
    uVar2 = uVar2 + this->m_color[lVar5].field_0.field_0.b;
    uVar1 = uVar1 + this->m_color[lVar5].field_0.field_0.a;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  in_RDI[2] = (char)(uVar4 >> 4);
  in_RDI[1] = (char)(uVar3 >> 4);
  *in_RDI = (char)(uVar2 >> 4);
  in_RDI[3] = (char)(uVar1 >> 4);
  return (Color32)SUB84(in_RDI,0);
}

Assistant:

Color32 ColorBlock::averageColor() const
{
	uint r, g, b, a;
	r = g = b = a = 0;

	for(uint i = 0; i < 16; i++) {
		r += m_color[i].r;
		g += m_color[i].g;
		b += m_color[i].b;
		a += m_color[i].a;
	}
	
	return Color32(uint8(r / 16), uint8(g / 16), uint8(b / 16), uint8(a / 16));
}